

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_box_set.cpp
# Opt level: O1

uint __thiscall
GIM_BOX_TREE::_sort_and_calc_splitting_index
          (GIM_BOX_TREE *this,gim_array<GIM_AABB_DATA> *primitive_boxes,uint startIndex,
          uint endIndex,uint splitAxis)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  float *pfVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [64];
  undefined1 in_XMM3 [16];
  
  uVar15 = endIndex - startIndex;
  auVar22 = ZEXT1664(ZEXT816(0) << 0x40);
  uVar19 = (ulong)startIndex;
  if (startIndex <= endIndex && uVar15 != 0) {
    pfVar18 = (float *)(*(long *)primitive_boxes + 0x10 + (ulong)splitAxis * 4 + uVar19 * 0x24);
    lVar20 = endIndex - uVar19;
    do {
      auVar5 = vfmadd231ss_fma(auVar22._0_16_,ZEXT416((uint)(*pfVar18 + pfVar18[-4])),
                               SUB6416(ZEXT464(0x3f000000),0));
      auVar22 = ZEXT1664(auVar5);
      pfVar18 = pfVar18 + 9;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
  }
  uVar17 = startIndex;
  if (startIndex < endIndex) {
    auVar5 = vcvtusi2ss_avx512f(in_XMM3,uVar15);
    lVar21 = uVar19 * 0x24;
    lVar20 = (ulong)splitAxis * 4;
    lVar14 = endIndex - uVar19;
    do {
      lVar4 = *(long *)primitive_boxes;
      puVar1 = (undefined8 *)(lVar4 + lVar21);
      if (auVar22._0_4_ / auVar5._0_4_ <
          (*(float *)(lVar20 + 0x10 + (long)puVar1) + *(float *)(lVar20 + (long)puVar1)) * 0.5) {
        puVar2 = (undefined8 *)(lVar4 + 0x10 + lVar21);
        uVar19 = (ulong)uVar17;
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        uVar8 = *puVar2;
        uVar9 = puVar2[1];
        uVar3 = *(undefined4 *)(puVar2 + 2);
        *(undefined4 *)(puVar1 + 4) = *(undefined4 *)(lVar4 + 0x20 + uVar19 * 0x24);
        puVar2 = (undefined8 *)(lVar4 + uVar19 * 0x24);
        uVar10 = puVar2[1];
        uVar11 = puVar2[2];
        uVar12 = puVar2[3];
        *puVar1 = *puVar2;
        puVar1[1] = uVar10;
        puVar1[2] = uVar11;
        puVar1[3] = uVar12;
        puVar1 = (undefined8 *)(lVar4 + uVar19 * 0x24);
        *puVar1 = uVar6;
        puVar1[1] = uVar7;
        puVar1[2] = uVar8;
        puVar1[3] = uVar9;
        *(undefined4 *)(lVar4 + 0x20 + uVar19 * 0x24) = uVar3;
        uVar17 = uVar17 + 1;
      }
      lVar21 = lVar21 + 0x24;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  uVar16 = (uVar15 >> 1) + startIndex;
  uVar13 = uVar17;
  if (~(uVar15 / 3) + endIndex <= uVar17) {
    uVar13 = uVar16;
  }
  if (uVar17 <= uVar15 / 3 + startIndex) {
    uVar13 = uVar16;
  }
  return uVar13;
}

Assistant:

GUINT GIM_BOX_TREE::_sort_and_calc_splitting_index(
	gim_array<GIM_AABB_DATA>& primitive_boxes, GUINT startIndex,
	GUINT endIndex, GUINT splitAxis)
{
	GUINT i;
	GUINT splitIndex = startIndex;
	GUINT numIndices = endIndex - startIndex;

	// average of centers
	cbtScalar splitValue = 0.0f;
	for (i = startIndex; i < endIndex; i++)
	{
		splitValue += 0.5f * (primitive_boxes[i].m_bound.m_max[splitAxis] +
							  primitive_boxes[i].m_bound.m_min[splitAxis]);
	}
	splitValue /= (cbtScalar)numIndices;

	//sort leafNodes so all values larger then splitValue comes first, and smaller values start from 'splitIndex'.
	for (i = startIndex; i < endIndex; i++)
	{
		cbtScalar center = 0.5f * (primitive_boxes[i].m_bound.m_max[splitAxis] +
								  primitive_boxes[i].m_bound.m_min[splitAxis]);
		if (center > splitValue)
		{
			//swap
			primitive_boxes.swap(i, splitIndex);
			splitIndex++;
		}
	}

	//if the splitIndex causes unbalanced trees, fix this by using the center in between startIndex and endIndex
	//otherwise the tree-building might fail due to stack-overflows in certain cases.
	//unbalanced1 is unsafe: it can cause stack overflows
	//bool unbalanced1 = ((splitIndex==startIndex) || (splitIndex == (endIndex-1)));

	//unbalanced2 should work too: always use center (perfect balanced trees)
	//bool unbalanced2 = true;

	//this should be safe too:
	GUINT rangeBalancedIndices = numIndices / 3;
	bool unbalanced = ((splitIndex <= (startIndex + rangeBalancedIndices)) || (splitIndex >= (endIndex - 1 - rangeBalancedIndices)));

	if (unbalanced)
	{
		splitIndex = startIndex + (numIndices >> 1);
	}

	cbtAssert(!((splitIndex == startIndex) || (splitIndex == (endIndex))));

	return splitIndex;
}